

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall TestValueTestbools::runTestCase(TestValueTestbools *this)

{
  Value *this_00;
  Value *value;
  TestResult *pTVar1;
  double dVar2;
  bool bVar3;
  ValueType actual;
  Int IVar4;
  UInt UVar5;
  LargestInt LVar6;
  LargestUInt LVar7;
  float fVar8;
  IsCheck checks;
  IsCheck local_68;
  PredicateContext local_58;
  
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  this_00 = &(this->super_ValueTest).false_;
  actual = Json::Value::type(this_00);
  JsonTest::checkEqual<Json::ValueType,Json::ValueType>
            (pTVar1,booleanValue,actual,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x13e,"Json::booleanValue == false_.type()");
  local_68.isUInt64_ = false;
  local_68.isIntegral_ = false;
  local_68.isDouble_ = false;
  local_68.isNumeric_ = false;
  local_68.isObject_ = false;
  local_68.isArray_ = false;
  local_68.isBool_ = true;
  local_68.isString_ = false;
  local_68.isNull_ = false;
  local_68.isInt_ = false;
  local_68.isInt64_ = false;
  local_68.isUInt_ = false;
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_58.id_ = pTVar1->predicateId_;
  local_58.file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_58.line_ = 0x142;
  local_58.expr_ = "checkIs(false_, checks)";
  local_58.next_ = (PredicateContext *)0x0;
  local_58.failure_ = (Failure *)0x0;
  pTVar1->predicateStackTail_->next_ = &local_58;
  pTVar1->predicateId_ = local_58.id_ + 1;
  pTVar1->predicateStackTail_ = &local_58;
  ValueTest::checkIs(&this->super_ValueTest,this_00,&local_68);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_58.id_ = pTVar1->predicateId_;
  local_58.file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_58.line_ = 0x143;
  local_58.expr_ = "checkIs(true_, checks)";
  local_58.next_ = (PredicateContext *)0x0;
  local_58.failure_ = (Failure *)0x0;
  pTVar1->predicateStackTail_->next_ = &local_58;
  pTVar1->predicateId_ = local_58.id_ + 1;
  pTVar1->predicateStackTail_ = &local_58;
  value = &(this->super_ValueTest).true_;
  ValueTest::checkIs(&this->super_ValueTest,value,&local_68);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  bVar3 = Json::Value::isConvertibleTo(this_00,nullValue);
  if (!bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x146,"false_.isConvertibleTo(Json::nullValue)");
  }
  bVar3 = Json::Value::isConvertibleTo(value,nullValue);
  if (bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x149,"!true_.isConvertibleTo(Json::nullValue)");
  }
  bVar3 = Json::Value::isConvertibleTo(value,intValue);
  if (!bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x14c,"true_.isConvertibleTo(Json::intValue)");
  }
  bVar3 = Json::Value::isConvertibleTo(value,uintValue);
  if (!bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x14d,"true_.isConvertibleTo(Json::uintValue)");
  }
  bVar3 = Json::Value::isConvertibleTo(value,realValue);
  if (!bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x14e,"true_.isConvertibleTo(Json::realValue)");
  }
  bVar3 = Json::Value::isConvertibleTo(value,booleanValue);
  if (!bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x14f,"true_.isConvertibleTo(Json::booleanValue)");
  }
  bVar3 = Json::Value::isConvertibleTo(value,stringValue);
  if (!bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x150,"true_.isConvertibleTo(Json::stringValue)");
  }
  bVar3 = Json::Value::isConvertibleTo(value,arrayValue);
  if (bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x153,"!true_.isConvertibleTo(Json::arrayValue)");
  }
  bVar3 = Json::Value::isConvertibleTo(value,objectValue);
  if (bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x154,"!true_.isConvertibleTo(Json::objectValue)");
  }
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  bVar3 = Json::Value::asBool(value);
  JsonTest::checkEqual<bool,bool>
            (pTVar1,true,bVar3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x156,"true == true_.asBool()");
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  IVar4 = Json::Value::asInt(value);
  JsonTest::checkEqual<int,int>
            (pTVar1,1,IVar4,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x157,"1 == true_.asInt()");
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  LVar6 = Json::Value::asLargestInt(value);
  JsonTest::checkEqual<int,long_long>
            (pTVar1,1,LVar6,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x158,"1 == true_.asLargestInt()");
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  UVar5 = Json::Value::asUInt(value);
  JsonTest::checkEqual<int,unsigned_int>
            (pTVar1,1,UVar5,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x159,"1 == true_.asUInt()");
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  LVar7 = Json::Value::asLargestUInt(value);
  JsonTest::checkEqual<int,unsigned_long_long>
            (pTVar1,1,LVar7,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x15a,"1 == true_.asLargestUInt()");
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  dVar2 = Json::Value::asDouble(value);
  JsonTest::checkEqual<double,double>
            (pTVar1,1.0,dVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x15b,"1.0 == true_.asDouble()");
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  fVar8 = Json::Value::asFloat(value);
  JsonTest::checkEqual<double,float>
            (pTVar1,1.0,fVar8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x15c,"1.0 == true_.asFloat()");
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  bVar3 = Json::Value::asBool(this_00);
  JsonTest::checkEqual<bool,bool>
            (pTVar1,false,bVar3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x15e,"false == false_.asBool()");
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  IVar4 = Json::Value::asInt(this_00);
  JsonTest::checkEqual<int,int>
            (pTVar1,0,IVar4,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x15f,"0 == false_.asInt()");
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  LVar6 = Json::Value::asLargestInt(this_00);
  JsonTest::checkEqual<int,long_long>
            (pTVar1,0,LVar6,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x160,"0 == false_.asLargestInt()");
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  UVar5 = Json::Value::asUInt(this_00);
  JsonTest::checkEqual<int,unsigned_int>
            (pTVar1,0,UVar5,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x161,"0 == false_.asUInt()");
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  LVar7 = Json::Value::asLargestUInt(this_00);
  JsonTest::checkEqual<int,unsigned_long_long>
            (pTVar1,0,LVar7,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x162,"0 == false_.asLargestUInt()");
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  dVar2 = Json::Value::asDouble(this_00);
  JsonTest::checkEqual<double,double>
            (pTVar1,0.0,dVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x163,"0.0 == false_.asDouble()");
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  fVar8 = Json::Value::asFloat(this_00);
  JsonTest::checkEqual<double,float>
            (pTVar1,0.0,fVar8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x164,"0.0 == false_.asFloat()");
  return;
}

Assistant:

JSONTEST_FIXTURE(ValueTest, bools) {
  JSONTEST_ASSERT_EQUAL(Json::booleanValue, false_.type());

  IsCheck checks;
  checks.isBool_ = true;
  JSONTEST_ASSERT_PRED(checkIs(false_, checks));
  JSONTEST_ASSERT_PRED(checkIs(true_, checks));

  // False okay
  JSONTEST_ASSERT(false_.isConvertibleTo(Json::nullValue));

  // True not okay
  JSONTEST_ASSERT(!true_.isConvertibleTo(Json::nullValue));

  // Always okay
  JSONTEST_ASSERT(true_.isConvertibleTo(Json::intValue));
  JSONTEST_ASSERT(true_.isConvertibleTo(Json::uintValue));
  JSONTEST_ASSERT(true_.isConvertibleTo(Json::realValue));
  JSONTEST_ASSERT(true_.isConvertibleTo(Json::booleanValue));
  JSONTEST_ASSERT(true_.isConvertibleTo(Json::stringValue));

  // Never okay
  JSONTEST_ASSERT(!true_.isConvertibleTo(Json::arrayValue));
  JSONTEST_ASSERT(!true_.isConvertibleTo(Json::objectValue));

  JSONTEST_ASSERT_EQUAL(true, true_.asBool());
  JSONTEST_ASSERT_EQUAL(1, true_.asInt());
  JSONTEST_ASSERT_EQUAL(1, true_.asLargestInt());
  JSONTEST_ASSERT_EQUAL(1, true_.asUInt());
  JSONTEST_ASSERT_EQUAL(1, true_.asLargestUInt());
  JSONTEST_ASSERT_EQUAL(1.0, true_.asDouble());
  JSONTEST_ASSERT_EQUAL(1.0, true_.asFloat());

  JSONTEST_ASSERT_EQUAL(false, false_.asBool());
  JSONTEST_ASSERT_EQUAL(0, false_.asInt());
  JSONTEST_ASSERT_EQUAL(0, false_.asLargestInt());
  JSONTEST_ASSERT_EQUAL(0, false_.asUInt());
  JSONTEST_ASSERT_EQUAL(0, false_.asLargestUInt());
  JSONTEST_ASSERT_EQUAL(0.0, false_.asDouble());
  JSONTEST_ASSERT_EQUAL(0.0, false_.asFloat());
}